

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

bool __thiscall MetaCommand::ExportGAD(MetaCommand *this,bool dynamic)

{
  size_type sVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  MetaCommand *pMVar4;
  undefined4 uVar5;
  size_t sVar6;
  ostream *poVar7;
  long lVar8;
  pointer pFVar9;
  undefined1 uVar10;
  pointer pOVar11;
  undefined7 in_register_00000031;
  char *pcVar12;
  char cVar13;
  string datapath;
  OptionVector options;
  string filename;
  ofstream file;
  undefined1 auStack_2c8 [12];
  int local_2bc;
  string local_2b8;
  vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> local_298;
  undefined4 local_27c;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  char *local_258 [2];
  char local_248 [16];
  MetaCommand *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Exporting GAD file...",0x15);
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::vector
            (&local_298,&this->m_OptionVector);
  if ((int)CONCAT71(in_register_00000031,dynamic) != 0) {
    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::operator=
              (&local_298,&this->m_ParsedOptionVector);
  }
  sVar1 = (this->m_Name)._M_string_length;
  if (sVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Set the name of the application using SetName()",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    uVar10 = 0;
  }
  else {
    local_258[0] = local_248;
    pcVar2 = (this->m_Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_258,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)local_258);
    std::ofstream::ofstream(&local_230);
    std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_258[0]);
    uVar5 = std::__basic_file<char>::is_open();
    if ((char)uVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot open file for writing: ",0x1e);
      pcVar12 = local_258[0];
      if (local_258[0] == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
      }
      else {
        sVar6 = strlen(local_258[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"<?xml version=\"1.0\" encoding=\"UTF-8\" ?>",0x27);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"<gridApplication",0x10);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\"",
                 0x35);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,
                 "xsi:noNamespaceSchemaLocation=\"grid-application-description.xsd\"",0x40);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"name=\"",6);
      pcVar12 = (this->m_Name)._M_dataplus._M_p;
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
      }
      else {
        sVar6 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar12,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\"",1);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"description=\"",0xd)
      ;
      pcVar12 = (this->m_Description)._M_dataplus._M_p;
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
      }
      else {
        sVar6 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar12,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\">",2);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,
                 "<applicationComponent name=\"Client\" remoteExecution=\"true\">",0x3b);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"<componentActionList>",0x15);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      cVar13 = (char)(ostream *)&local_230;
      std::ostream::put(cVar13);
      std::ostream::flush();
      local_27c = uVar5;
      local_238 = this;
      if (local_298.super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_298.super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_2bc = 1;
      }
      else {
        local_2bc = 1;
        pOVar11 = local_298.
                  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          for (pFVar9 = (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pFVar9 != (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_finish; pFVar9 = pFVar9 + 1) {
            if (pFVar9->externaldata == DATA_IN) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230," <componentAction type=\"DataRelocation\" order=\"",
                         0x2f);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\">",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Name\" value=\"",0x20);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_230,(pFVar9->name)._M_dataplus._M_p,
                                  (pFVar9->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"/>",3);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Host\" value=\"hostname\"/>",
                         0x2b);
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Description\" value=\"",0x27);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_230,(pFVar9->description)._M_dataplus._M_p,
                                  (pFVar9->description)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"/>",3);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Direction\" value=\"In\"/>",0x2a
                        );
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Protocol\" value=\"gsiftp\"/>",
                         0x2d);
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"SourceDataPath\" value=\"",0x2a)
              ;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_230,(pFVar9->value)._M_dataplus._M_p,
                                  (pFVar9->value)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"/>",3);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              pcVar2 = (pFVar9->value)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b8,pcVar2,pcVar2 + (pFVar9->value)._M_string_length);
              lVar8 = std::__cxx11::string::find_last_of
                                ((char *)&local_2b8,0x16b541,0xffffffffffffffff);
              if (lVar8 != 0) {
                std::__cxx11::string::substr((ulong)local_278,(ulong)&local_2b8);
                std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_278);
                if (local_278[0] != local_268) {
                  operator_delete(local_278[0]);
                }
              }
              lVar8 = std::__cxx11::string::find_last_of
                                ((char *)&local_2b8,0x179326,0xffffffffffffffff);
              if (lVar8 != 0) {
                std::__cxx11::string::substr((ulong)local_278,(ulong)&local_2b8);
                std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_278);
                if (local_278[0] != local_268) {
                  operator_delete(local_278[0]);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"DestDataPath\" value=\"",0x28);
              _Var3._M_p = local_2b8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
              }
              else {
                sVar6 = strlen(local_2b8._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,_Var3._M_p,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\"/>",3);
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230," </componentAction>",0x13);
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p);
              }
              local_2bc = local_2bc + 1;
            }
          }
          pOVar11 = pOVar11 + 1;
        } while (pOVar11 !=
                 local_298.
                 super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230," <componentAction type=\"JobSubmission\" order=\"",0x2e);
      pMVar4 = local_238;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\">",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"  <parameter name=\"Executable\" value=\"",0x26);
      pcVar12 = (pMVar4->m_ExecutableName)._M_dataplus._M_p;
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
      }
      else {
        sVar6 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar12,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\"/>",3);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"  <parameter name=\"Arguments\"  value=\"",0x26);
      if (local_298.super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_298.super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pOVar11 = local_298.
                  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          if (pOVar11 !=
              local_298.
              super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
              super__Vector_impl_data._M_start) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"{",1);
          pcVar12 = (pOVar11->name)._M_dataplus._M_p;
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
          }
          else {
            sVar6 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar12,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"}",1);
          pOVar11 = pOVar11 + 1;
        } while (pOVar11 !=
                 local_298.
                 super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\"/>",3);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      cVar13 = (char)(ostream *)&local_230;
      std::ostream::put(cVar13);
      std::ostream::flush();
      pOVar11 = local_298.
                super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_298.super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_298.super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          for (pFVar9 = (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pFVar9 != (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_finish; pFVar9 = pFVar9 + 1) {
            if (pFVar9->externaldata != DATA_NONE) goto LAB_0011d54d;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"   <group name=\"",0x10);
          pcVar12 = (pOVar11->name)._M_dataplus._M_p;
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
          }
          else {
            sVar6 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar12,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"\" syntax=\"",10);
          if ((pOVar11->tag)._M_string_length != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"-",1);
            pcVar12 = (pOVar11->tag)._M_dataplus._M_p;
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
            }
            else {
              sVar6 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar12,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
          }
          for (pFVar9 = (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pFVar9 != (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_finish; pFVar9 = pFVar9 + 1) {
            if (pFVar9 != (pOVar11->fields).
                          super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"{",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_230,(pOVar11->name)._M_dataplus._M_p,
                                (pOVar11->name)._M_string_length);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(pFVar9->name)._M_dataplus._M_p,
                                (pFVar9->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\"",1);
          if (pOVar11->required == false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230," optional=\"true\"",0x10);
            pcVar12 = " selected=\"false\"";
            if ((ulong)pOVar11->userDefined != 0) {
              pcVar12 = " selected=\"true\"";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,pcVar12,(ulong)pOVar11->userDefined ^ 0x11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,">",1);
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
          std::ostream::put(cVar13);
          std::ostream::flush();
          for (pFVar9 = (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pFVar9 != (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_finish; pFVar9 = pFVar9 + 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,"    <argument name=\"",0x14);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_230,(pOVar11->name)._M_dataplus._M_p,
                                (pOVar11->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,(pFVar9->name)._M_dataplus._M_p,(pFVar9->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,"\" value=\"",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,(pFVar9->value)._M_dataplus._M_p,
                       (pFVar9->value)._M_string_length);
            pcVar12 = "\" type=\"";
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\" type=\"",8)
            ;
            TypeToString_abi_cxx11_(&local_2b8,(MetaCommand *)pcVar12,pFVar9->type);
            _Var3._M_p = local_2b8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
            }
            else {
              sVar6 = strlen(local_2b8._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,_Var3._M_p,sVar6);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\"",1);
            if ((pFVar9->rangeMin)._M_string_length != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230," rangeMin=\"",0xb);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_230,(pFVar9->rangeMin)._M_dataplus._M_p,
                                  (pFVar9->rangeMin)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            }
            if ((pFVar9->rangeMax)._M_string_length != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230," rangeMax=\"",0xb);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_230,(pFVar9->rangeMax)._M_dataplus._M_p,
                                  (pFVar9->rangeMax)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"/>",2);
            std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
            std::ostream::put(cVar13);
            std::ostream::flush();
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"  </group>",10);
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
          std::ostream::put(cVar13);
          std::ostream::flush();
LAB_0011d54d:
          pOVar11 = pOVar11 + 1;
        } while (pOVar11 !=
                 local_298.
                 super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230," </componentAction>",0x13);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      cVar13 = (char)(ostream *)&local_230;
      std::ostream::put(cVar13);
      std::ostream::flush();
      if (local_298.super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_298.super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_2bc = local_2bc + 1;
        pOVar11 = local_298.
                  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          for (pFVar9 = (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pFVar9 != (pOVar11->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_finish; pFVar9 = pFVar9 + 1) {
            if (pFVar9->externaldata == DATA_OUT) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230," <componentAction type=\"DataRelocation\" order=\"",
                         0x2f);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\">",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Name\" Value=\"",0x20);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_230,(pFVar9->name)._M_dataplus._M_p,
                                  (pFVar9->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"/>",3);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Host\" Value=\"hostname\"/>",
                         0x2b);
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Description\" value=\"",0x27);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_230,(pFVar9->description)._M_dataplus._M_p,
                                  (pFVar9->description)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"/>",3);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Direction\" value=\"Out\"/>",
                         0x2b);
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"Protocol\" value=\"gsiftp\"/>",
                         0x2d);
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              pcVar2 = (pFVar9->value)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b8,pcVar2,pcVar2 + (pFVar9->value)._M_string_length);
              lVar8 = std::__cxx11::string::find_last_of
                                ((char *)&local_2b8,0x16b541,0xffffffffffffffff);
              if (lVar8 != 0) {
                std::__cxx11::string::substr((ulong)local_278,(ulong)&local_2b8);
                std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_278);
                if (local_278[0] != local_268) {
                  operator_delete(local_278[0]);
                }
              }
              lVar8 = std::__cxx11::string::find_last_of
                                ((char *)&local_2b8,0x179326,0xffffffffffffffff);
              if (lVar8 != 0) {
                std::__cxx11::string::substr((ulong)local_278,(ulong)&local_2b8);
                std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_278);
                if (local_278[0] != local_268) {
                  operator_delete(local_278[0]);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"SourceDataPath\" value=\"",0x2a)
              ;
              _Var3._M_p = local_2b8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                std::ios::clear((int)auStack_2c8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x98);
              }
              else {
                sVar6 = strlen(local_2b8._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,_Var3._M_p,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\"/>",3);
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"  <parameter name=\"DestDataPath\" value=\"",0x28);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_230,(pFVar9->value)._M_dataplus._M_p,
                                  (pFVar9->value)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"/>",3);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230," </componentAction>",0x13);
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p);
              }
              local_2bc = local_2bc + 1;
            }
          }
          pOVar11 = pOVar11 + 1;
        } while (pOVar11 !=
                 local_298.
                 super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"    </componentActionList>",0x1a);
      uVar5 = local_27c;
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"  </applicationComponent>",0x19);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"</gridApplication>",0x12);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      std::ofstream::close();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    uVar10 = (undefined1)uVar5;
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _getpwnam;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    if (local_258[0] != local_248) {
      operator_delete(local_258[0]);
    }
  }
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::~vector(&local_298);
  return (bool)uVar10;
}

Assistant:

bool MetaCommand::ExportGAD(bool dynamic)
{
  METAIO_STREAM::cout << "Exporting GAD file...";

  OptionVector options = m_OptionVector;
  if(dynamic)
    {
    options = m_ParsedOptionVector;
    }

    if (m_Name.empty()) {
      METAIO_STREAM::cout << "Set the name of the application using SetName()"
                          << METAIO_STREAM::endl;
      return false;
    }

  METAIO_STL::string filename = m_Name;
  filename += ".gad.xml";

  METAIO_STREAM::ofstream file;
  file.open(filename.c_str(), METAIO_STREAM::ios::binary | METAIO_STREAM::ios::out);
  if(!file.is_open())
    {
    METAIO_STREAM::cout << "Cannot open file for writing: " << filename.c_str() <<  METAIO_STREAM::endl;
    return false;
    }

    file << R"(<?xml version="1.0" encoding="UTF-8" ?>)" << METAIO_STREAM::endl;
    file << "<gridApplication" << METAIO_STREAM::endl;
    file << "xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\""
         << METAIO_STREAM::endl;
    file << "xsi:noNamespaceSchemaLocation=\"grid-application-description.xsd\""
         << METAIO_STREAM::endl;
    file << "name=\"" << m_Name.c_str() << "\"" << METAIO_STREAM::endl;
    file << "description=\"" << m_Description.c_str() << "\">"
         << METAIO_STREAM::endl;
    file << R"(<applicationComponent name="Client" remoteExecution="true">)"
         << METAIO_STREAM::endl;
    file << "<componentActionList>" << METAIO_STREAM::endl;
    file << METAIO_STREAM::endl;

    unsigned int order = 1;
    // Write out the input data to be transfered
    OptionVector::const_iterator it = options.begin();
    while (it != options.end()) {
      auto itFields = (*it).fields.begin();
      while (itFields != (*it).fields.end()) {
        if ((*itFields).externaldata == DATA_IN) {
          file << R"( <componentAction type="DataRelocation" order=")" << order
               << "\">" << METAIO_STREAM::endl;
          file << R"(  <parameter name="Name" value=")" << (*itFields).name
               << "\"/>" << METAIO_STREAM::endl;
          file << R"(  <parameter name="Host" value="hostname"/>)"
               << METAIO_STREAM::endl;
          file << R"(  <parameter name="Description" value=")"
               << (*itFields).description << "\"/>" << METAIO_STREAM::endl;
          file << R"(  <parameter name="Direction" value="In"/>)"
               << METAIO_STREAM::endl;
          file << R"(  <parameter name="Protocol" value="gsiftp"/>)"
               << METAIO_STREAM::endl;
          file << R"(  <parameter name="SourceDataPath" value=")"
               << (*itFields).value << "\"/>" << METAIO_STREAM::endl;

          METAIO_STL::string datapath = (*itFields).value;
          size_t slash = datapath.find_last_of("/");
          if (slash > 0) {
            datapath = datapath.substr(slash + 1, datapath.size() - slash - 1);
          }
        slash = datapath.find_last_of("\\");
        if(slash>0)
          {
          datapath = datapath.substr(slash+1,datapath.size()-slash-1);
          }
          file << R"(  <parameter name="DestDataPath" value=")"
               << datapath.c_str() << "\"/>" << METAIO_STREAM::endl;
          file << " </componentAction>" << METAIO_STREAM::endl;
          file << METAIO_STREAM::endl;
          ++order;
        }
      ++itFields;
      }
    ++it;
    }

    file << R"( <componentAction type="JobSubmission" order=")" << order
         << "\">" << METAIO_STREAM::endl;
    file << R"(  <parameter name="Executable" value=")"
         << m_ExecutableName.c_str() << "\"/>" << METAIO_STREAM::endl;
    file << R"(  <parameter name="Arguments"  value=")";
    // Write out the command line arguments
    it = options.begin();
    while (it != options.end()) {
      if (it != options.begin()) {
        file << " ";
      }
    file << "{" << (*it).name.c_str() << "}";
    ++it;
    }
  file << "\"/>" << METAIO_STREAM::endl;
  // Write out the arguments that are not data
  it = options.begin();
  while(it != options.end())
    {
    // Find if this is a non data field
    bool isData = false;
    auto itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      if((*itFields).externaldata != DATA_NONE)
        {
        isData = true;
        break;
        }
      ++itFields;
      }

    if(isData)
      {
      ++it;
      continue;
      }

    file << "   <group name=\"" << (*it).name.c_str();
    file << "\" syntax=\"";

    if (!(*it).tag.empty()) {
      file << "-" << (*it).tag.c_str() << " ";
    }

    itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      if(itFields != (*it).fields.begin())
        {
        file << " ";
        }
      file << "{" << (*it).name << (*itFields).name << "}";
      ++itFields;
      }
    file << "\"";

    if(!(*it).required)
      {
      file << " optional=\"true\"";

      // Add if the option was selected
      if((*it).userDefined)
        {
        file << " selected=\"true\"";
        }
      else
        {
        file << " selected=\"false\"";
        }
      }

    file << ">" << METAIO_STREAM::endl;

    // Now writes the value of the arguments
    itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      file << "    <argument name=\"" << (*it).name << (*itFields).name;
      file << "\" value=\"" << (*itFields).value;
      file << "\" type=\"" << this->TypeToString((*itFields).type).c_str();
      file << "\"";

      if (!(*itFields).rangeMin.empty()) {
        file << " rangeMin=\"" << (*itFields).rangeMin << "\"";
      }

      if (!(*itFields).rangeMax.empty()) {
        file << " rangeMax=\"" << (*itFields).rangeMax << "\"";
      }
      file << "/>" << METAIO_STREAM::endl;
      ++itFields;
      }
    file << "  </group>" << METAIO_STREAM::endl;
    ++it;
    }
  file << " </componentAction>" << METAIO_STREAM::endl;
  ++order;
  file << METAIO_STREAM::endl;
  // Write out the input data to be transfered
  it = options.begin();
  while(it != options.end())
    {
    auto itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      if((*itFields).externaldata == DATA_OUT)
        {
        file << R"( <componentAction type="DataRelocation" order=")" << order
             << "\">" << METAIO_STREAM::endl;
        file << R"(  <parameter name="Name" Value=")" << (*itFields).name
             << "\"/>" << METAIO_STREAM::endl;
        file << R"(  <parameter name="Host" Value="hostname"/>)"
             << METAIO_STREAM::endl;
        file << R"(  <parameter name="Description" value=")"
             << (*itFields).description << "\"/>" << METAIO_STREAM::endl;
        file << R"(  <parameter name="Direction" value="Out"/>)"
             << METAIO_STREAM::endl;
        file << R"(  <parameter name="Protocol" value="gsiftp"/>)"
             << METAIO_STREAM::endl;
        METAIO_STL::string datapath = (*itFields).value;
        size_t slash = datapath.find_last_of("/");
        if(slash>0)
          {
          datapath = datapath.substr(slash+1,datapath.size()-slash-1);
          }
        slash = datapath.find_last_of("\\");
        if(slash>0)
          {
          datapath = datapath.substr(slash+1,datapath.size()-slash-1);
          }
          file << R"(  <parameter name="SourceDataPath" value=")"
               << datapath.c_str() << "\"/>" << METAIO_STREAM::endl;
          file << R"(  <parameter name="DestDataPath" value=")"
               << (*itFields).value << "\"/>" << METAIO_STREAM::endl;
          file << " </componentAction>" << METAIO_STREAM::endl;
          file << METAIO_STREAM::endl;
          ++order;
        }
      ++itFields;
      }
    ++it;
    }
  file << "    </componentActionList>" << METAIO_STREAM::endl;
  file << "  </applicationComponent>" << METAIO_STREAM::endl;
  file << "</gridApplication>" << METAIO_STREAM::endl;

  file.close();

  METAIO_STREAM::cout << "done" << METAIO_STREAM::endl;
  return true;
}